

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

void __thiscall
BackwardPass::ClearBucketsOnFieldKill<AddPropertyCacheBucket>
          (BackwardPass *this,Instr *instr,
          HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> *table)

{
  bool bVar1;
  Opnd *this_00;
  RegOpnd *pRVar2;
  Opnd *dst;
  HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> *table_local;
  Instr *instr_local;
  BackwardPass *this_local;
  
  if (table != (HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> *)0x0) {
    bVar1 = IR::Instr::UsesAllFields(instr);
    if (bVar1) {
      HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator>::ClearAll(table);
    }
    else {
      this_00 = IR::Instr::GetDst(instr);
      if ((this_00 != (Opnd *)0x0) && (bVar1 = IR::Opnd::IsRegOpnd(this_00), bVar1)) {
        pRVar2 = IR::Opnd::AsRegOpnd(this_00);
        HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator>::Clear
                  (table,(pRVar2->m_sym->super_Sym).m_id);
      }
    }
  }
  return;
}

Assistant:

void
BackwardPass::ClearBucketsOnFieldKill(IR::Instr *instr, HashTable<T> *table)
{
    if (table)
    {
        if (instr->UsesAllFields())
        {
            table->ClearAll();
        }
        else
        {
            IR::Opnd *dst = instr->GetDst();
            if (dst && dst->IsRegOpnd())
            {
                table->Clear(dst->AsRegOpnd()->m_sym->m_id);
            }
        }
    }
}